

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void linenoiseEditDeletePrevWord(linenoiseState *l)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  size_t diff;
  size_t old_pos;
  linenoiseState *l_local;
  
  sVar1 = l->pos;
  while( true ) {
    bVar3 = false;
    if (l->pos != 0) {
      bVar3 = l->buf[l->pos - 1] == ' ';
    }
    if (!bVar3) break;
    l->pos = l->pos - 1;
  }
  while( true ) {
    bVar3 = false;
    if (l->pos != 0) {
      bVar3 = l->buf[l->pos - 1] != ' ';
    }
    if (!bVar3) break;
    l->pos = l->pos - 1;
  }
  sVar2 = l->pos;
  memmove(l->buf + l->pos,l->buf + sVar1,(l->len - sVar1) + 1);
  l->len = l->len - (sVar1 - sVar2);
  refreshLine(l);
  return;
}

Assistant:

void linenoiseEditDeletePrevWord(struct linenoiseState *l) {
	size_t old_pos = l->pos;
	size_t diff;

	while (l->pos > 0 && l->buf[l->pos-1] == ' ')
		l->pos--;
	while (l->pos > 0 && l->buf[l->pos-1] != ' ')
		l->pos--;
	diff = old_pos - l->pos;
	memmove(l->buf+l->pos,l->buf+old_pos,l->len-old_pos+1);
	l->len -= diff;
	refreshLine(l);
}